

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromFrequencies
               (HuffmanTree *tree,uint *frequencies,size_t mincodes,size_t numcodes,uint maxbitlen)

{
  void *pvVar1;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  bool bVar2;
  uint error;
  uint *in_stack_00000030;
  uint *in_stack_00000038;
  undefined7 in_stack_ffffffffffffffc8;
  ulong local_28;
  uint local_4;
  
  for (local_28 = in_RCX; bVar2 = *(int *)(in_RSI + (local_28 - 1) * 4) == 0,
      bVar2 && in_RDX < local_28; local_28 = local_28 - 1) {
  }
  *(uint *)(in_RDI + 0x18) = in_R8D;
  *(int *)(in_RDI + 0x1c) = (int)local_28;
  pvVar1 = lodepng_realloc((void *)((ulong)in_R8D << 0x20),
                           CONCAT17(bVar2 && in_RDX < local_28,in_stack_ffffffffffffffc8));
  *(void **)(in_RDI + 0x10) = pvVar1;
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = 0x53;
  }
  else {
    memset(*(void **)(in_RDI + 0x10),0,local_28 << 2);
    local_4 = lodepng_huffman_code_lengths
                        (in_stack_00000038,in_stack_00000030,(size_t)tree,frequencies._4_4_);
    if (local_4 == 0) {
      local_4 = HuffmanTree_makeFromLengths2((HuffmanTree *)CONCAT44(maxbitlen,error));
    }
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromFrequencies(HuffmanTree* tree, const unsigned* frequencies,
                                                size_t mincodes, size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  while(!frequencies[numcodes - 1] && numcodes > mincodes) --numcodes; /*trim zeroes*/
  tree->maxbitlen = maxbitlen;
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->lengths = (unsigned*)lodepng_realloc(tree->lengths, numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  /*initialize all lengths to 0*/
  memset(tree->lengths, 0, numcodes * sizeof(unsigned));

  error = lodepng_huffman_code_lengths(tree->lengths, frequencies, numcodes, maxbitlen);
  if(!error) error = HuffmanTree_makeFromLengths2(tree);
  return error;
}